

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_mbstr.cc
# Opt level: O0

int asn1_is_printable(uint32_t value)

{
  int iVar1;
  undefined1 local_11;
  undefined4 local_c;
  uint32_t value_local;
  
  if (value < 0x80) {
    iVar1 = OPENSSL_isalnum(value);
    local_11 = true;
    if (((((iVar1 == 0) && (local_11 = true, value != 0x20)) && (local_11 = true, value != 0x27)) &&
        ((((local_11 = true, value != 0x28 && (local_11 = true, value != 0x29)) &&
          ((local_11 = true, value != 0x2b &&
           ((local_11 = true, value != 0x2c && (local_11 = true, value != 0x2d)))))) &&
         (local_11 = true, value != 0x2e)))) &&
       (((local_11 = true, value != 0x2f && (local_11 = true, value != 0x3a)) &&
        (local_11 = true, value != 0x3d)))) {
      local_11 = value == 0x3f;
    }
    local_c = (uint)local_11;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

int asn1_is_printable(uint32_t value) {
  if (value > 0x7f) {
    return 0;
  }
  return OPENSSL_isalnum(value) ||  //
         value == ' ' || value == '\'' || value == '(' || value == ')' ||
         value == '+' || value == ',' || value == '-' || value == '.' ||
         value == '/' || value == ':' || value == '=' || value == '?';
}